

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O0

void lqGetBinPopulationStats(lqInternalDB *lq,int *min,int *max,float *average)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int objectCount;
  int i;
  int bincount;
  int nonEmptyBinCount;
  int totalCount;
  int maxPop;
  int minPop;
  lqCallBackFunction in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = 0x7fffffff;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  iVar1 = *(int *)(in_RDI + 0x18);
  iVar2 = *(int *)(in_RDI + 0x1c);
  iVar3 = *(int *)(in_RDI + 0x20);
  for (local_38 = 0; local_38 < iVar1 * iVar2 * iVar3; local_38 = local_38 + 1) {
    iVar4 = 0;
    lqMapOverAllObjectsInBin
              ((lqClientProxy *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (void *)0x15c9f3);
    if (0 < iVar4) {
      local_30 = local_30 + 1;
      if (local_28 < iVar4) {
        local_28 = iVar4;
      }
      if (iVar4 < local_24) {
        local_24 = iVar4;
      }
      local_2c = iVar4 + local_2c;
    }
  }
  *in_RSI = local_24;
  *in_RDX = local_28;
  *in_RCX = (float)local_2c / (float)local_30;
  return;
}

Assistant:

void lqGetBinPopulationStats (lqInternalDB* lq,
                              int* min,
                              int* max,
                              float* average)
{
    int minPop = INT_MAX;
    int maxPop = 0;
    int totalCount = 0;
    int nonEmptyBinCount = 0;
    int bincount = lq->divx * lq->divy * lq->divz;
    int i;

    for (i=0; i<bincount; i++)
    {
        /* clear the counter */
        int objectCount = 0;

        /* apply counting function to each object in bin[i] */
	lqMapOverAllObjectsInBin (lq->bins[i], lqgbpsCounter, &objectCount);

        /* collect data: max and min population, count objects and non-empty bins */
        if (objectCount > 0)
        {
            nonEmptyBinCount++;
            if (maxPop < objectCount) maxPop = objectCount;
            if (minPop > objectCount) minPop = objectCount;
            totalCount += objectCount;
        }
    }

    /* set return values */
    *min = minPop;
    *max = maxPop;
    *average = ((float) totalCount) / ((float) nonEmptyBinCount);
}